

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_bin_gz.c
# Opt level: O3

void test_read_format_cpio_bin_gz(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a;
  archive_entry *ae;
  archive_entry *local_38;
  
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                   ,L'\'',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)0x0);
  iVar1 = archive_read_support_filter_gzip(a);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                   ,L'+');
    test_skipping("gzip reading not fully supported on this platform");
    iVar1 = archive_read_free(a);
    wVar2 = L',';
  }
  else {
    failure("archive_read_support_filter_gzip");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'0',0,"ARCHIVE_OK",(long)iVar1,"r",(void *)0x0);
    iVar1 = archive_read_support_format_all(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        (void *)0x0);
    iVar1 = archive_read_open_memory(a,archive,0x47);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_open_memory(a, archive, sizeof(archive))",(void *)0x0);
    iVar1 = archive_read_next_header(a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        (void *)0x0);
    iVar1 = archive_filter_code(a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'6',(long)iVar1,"archive_filter_code(a, 0)",1,"ARCHIVE_FILTER_GZIP",
                        (void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'7',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'8',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
    iVar1 = archive_format(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L'9',(long)iVar1,"archive_format(a)",0x10002,"ARCHIVE_FORMAT_CPIO_BIN_LE",
                        (void *)0x0);
    iVar1 = archive_read_close(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                        ,L':',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(a);
    wVar2 = L';';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_gz.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_bin_gz)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualInt(ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	failure("archive_read_support_filter_gzip");
	assertEqualInt(ARCHIVE_OK, r);
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_GZIP);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_BIN_LE);
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}